

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1005.cpp
# Opt level: O1

int main(void)

{
  undefined8 in_RAX;
  int iVar1;
  int q;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::istream::operator>>((istream *)&std::cin,&n);
  if (0 < n) {
    iVar1 = 0;
    do {
      std::istream::operator>>((istream *)&std::cin,(int *)((long)&uStack_28 + 4));
      if (a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
          == a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&a,
                   (iterator)
                   a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish,(int *)((long)&uStack_28 + 4));
      }
      else {
        *a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             uStack_28._4_4_;
        a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish + 1;
      }
      iVar1 = iVar1 + 1;
    } while (iVar1 < n);
  }
  f(0,0,0);
  std::ostream::operator<<((ostream *)&std::cout,min_);
  return 0;
}

Assistant:

int main() {
    std::cin >> n;
    for (int i = 0; i < n; ++i) {
        int q;
        std::cin >> q;
        a.push_back(q);
    }
    f(0, 0, 0);
    std::cout << min_;
    return 0;
}